

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Relay.cpp
# Opt level: O3

void __thiscall RenX_RelayPlugin::RenX_OnRaw(RenX_RelayPlugin *this,Server *server,string_view line)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  upstream_server_info *puVar2;
  _Elt_pointer ppuVar3;
  size_type sVar4;
  char __c;
  pointer pbVar5;
  __type_conflict1 _Var6;
  int iVar7;
  iterator iVar8;
  char *begin;
  size_type __rlen;
  size_t sVar9;
  long lVar10;
  upstream_server_info *puVar11;
  long lVar12;
  string_view in_message;
  undefined1 auVar13 [16];
  container_type_conflict tokens;
  string line_sanitized;
  container_type_conflict local_88;
  char *local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  __c = (char)RenX::DelimC;
  begin = line._M_str;
  jessilib::split<std::vector,_const_char_*,_const_char_*,_char>
            (&local_88,begin,begin + line._M_len,(char)RenX::DelimC);
  if ((local_88.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start ==
       local_88.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish) ||
     (local_68._M_dataplus._M_p = (pointer)server,
     iVar8 = std::
             _Hashtable<RenX::Server_*,_std::pair<RenX::Server_*const,_std::vector<RenX_RelayPlugin::upstream_server_info,_std::allocator<RenX_RelayPlugin::upstream_server_info>_>_>,_std::allocator<std::pair<RenX::Server_*const,_std::vector<RenX_RelayPlugin::upstream_server_info,_std::allocator<RenX_RelayPlugin::upstream_server_info>_>_>_>,_std::__detail::_Select1st,_std::equal_to<RenX::Server_*>,_std::hash<RenX::Server_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
             ::find(&(this->m_server_info_map)._M_h,(key_type *)&local_68),
     iVar8.
     super__Node_iterator_base<std::pair<RenX::Server_*const,_std::vector<RenX_RelayPlugin::upstream_server_info,_std::allocator<RenX_RelayPlugin::upstream_server_info>_>_>,_false>
     ._M_cur == (__node_type *)0x0)) goto LAB_00126075;
  if ((0x80 < (ulong)((long)local_88.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                     (long)local_88.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)) &&
     ((((iVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 compare(local_88.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start,"lRCON"), iVar7 == 0 &&
        (iVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 compare(local_88.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + 1,"Command;"), iVar7 == 0)) &&
       (iVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                compare(local_88.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start + 3,"executed:"), iVar7 == 0)) &&
      (local_88.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start[4]._M_string_length != 0)))) {
    auVar13 = RenX::Server::getRCONUsername();
    pbVar5 = local_88.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    sVar9 = auVar13._0_8_;
    if ((sVar9 == local_88.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[2]._M_string_length) &&
       ((sVar9 == 0 ||
        (iVar7 = bcmp(auVar13._8_8_,
                      local_88.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[2]._M_dataplus._M_p,sVar9),
        iVar7 == 0)))) {
      ppuVar3 = (this->m_command_tracker).
                super__Deque_base<RenX_RelayPlugin::upstream_server_info_*,_std::allocator<RenX_RelayPlugin::upstream_server_info_*>_>
                ._M_impl.super__Deque_impl_data._M_start._M_cur;
      if ((((this->m_command_tracker).
            super__Deque_base<RenX_RelayPlugin::upstream_server_info_*,_std::allocator<RenX_RelayPlugin::upstream_server_info_*>_>
            ._M_impl.super__Deque_impl_data._M_finish._M_cur != ppuVar3) &&
          ((puVar11 = *ppuVar3, puVar11 != (upstream_server_info *)0x0 &&
           (puVar11->m_processing_command == false)))) &&
         (_Var6 = std::operator==(pbVar5 + 4,
                                  &((puVar11->m_response_queue).
                                    super__Deque_base<RenX_RelayPlugin::UpstreamCommand,_std::allocator<RenX_RelayPlugin::UpstreamCommand>_>
                                    ._M_impl.super__Deque_impl_data._M_start._M_cur)->m_command),
         _Var6)) {
        puVar11->m_processing_command = true;
        paVar1 = &local_68.field_2;
        local_68._M_string_length = 0;
        local_68.field_2._M_local_buf[0] = '\0';
        sVar4 = (puVar11->m_settings->m_rcon_username)._M_string_length;
        local_68._M_dataplus._M_p = (pointer)paVar1;
        if (sVar4 == 0) {
          auVar13 = RenX::Server::getRCONUsername();
        }
        else {
          auVar13._8_8_ = (puVar11->m_settings->m_rcon_username)._M_dataplus._M_p;
          auVar13._0_8_ = sVar4;
        }
        local_70 = auVar13._8_8_;
        sVar9 = auVar13._0_8_;
        auVar13 = RenX::Server::getRCONUsername();
        if ((sVar9 == auVar13._0_8_) &&
           ((sVar9 == 0 || (iVar7 = bcmp(local_70,auVar13._8_8_,sVar9), iVar7 == 0)))) {
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          _M_replace(&local_68,0,local_68._M_string_length,begin,line._M_len);
        }
        else {
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          _M_replace(local_88.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + 2,0,
                     local_88.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[2]._M_string_length,local_70,sVar9);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
                    (&local_68,
                     local_88.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start);
          if ((long)local_88.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)local_88.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start != 0x20) {
            lVar12 = 1;
            lVar10 = 0x28;
            do {
              std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              push_back(&local_68,__c);
              std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              _M_append(&local_68,
                        *(char **)((long)local_88.
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start + lVar10 + -8),
                        *(size_type *)
                         ((long)&((local_88.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                         lVar10));
              lVar12 = lVar12 + 1;
              lVar10 = lVar10 + 0x20;
            } while (lVar12 != (long)local_88.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)local_88.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 5);
          }
        }
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                  (&local_68,'\n');
        in_message._M_str = local_68._M_dataplus._M_p;
        in_message._M_len = local_68._M_string_length;
        send_upstream(this,puVar11,in_message,server);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_68._M_dataplus._M_p != paVar1) {
          operator_delete(local_68._M_dataplus._M_p,
                          CONCAT71(local_68.field_2._M_allocated_capacity._1_7_,
                                   local_68.field_2._M_local_buf[0]) + 1);
        }
      }
      goto LAB_00126075;
    }
    if ((this->m_default_settings).m_suppress_rcon_command_logs != false) goto LAB_00126075;
  }
  puVar11 = *(upstream_server_info **)
             ((long)iVar8.
                    super__Node_iterator_base<std::pair<RenX::Server_*const,_std::vector<RenX_RelayPlugin::upstream_server_info,_std::allocator<RenX_RelayPlugin::upstream_server_info>_>_>,_false>
                    ._M_cur + 0x10);
  puVar2 = *(upstream_server_info **)
            ((long)iVar8.
                   super__Node_iterator_base<std::pair<RenX::Server_*const,_std::vector<RenX_RelayPlugin::upstream_server_info,_std::allocator<RenX_RelayPlugin::upstream_server_info>_>_>,_false>
                   ._M_cur + 0x18);
  if (puVar11 != puVar2) {
    do {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_48,&local_88);
      process_renx_message(this,server,puVar11,line,&local_48);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_48);
      puVar11 = puVar11 + 1;
    } while (puVar11 != puVar2);
  }
LAB_00126075:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_88);
  return;
}

Assistant:

void RenX_RelayPlugin::RenX_OnRaw(RenX::Server &server, std::string_view line) {
	// Not parsing any escape sequences, so data gets sent upstream exactly as it's received here. Copy tokens where needed to process escape sequences.
	auto tokens = jessilib::split(std::string_view{line}, RenX::DelimC);

	// Ensure valid message received
	if (tokens.empty()) {
		return;
	}

	// Check that we already have a session for this server
	auto server_info_map_itr = m_server_info_map.find(&server);
	if (server_info_map_itr == m_server_info_map.end()) {
		// early out: server not yet registered (i.e: finished auth)
		return;
	}

	// Suppress unassociated command execution logs from going upstream
	if (tokens.size() >= 5
		&& tokens[0] == "lRCON"
		&& tokens[1] == "Command;"
		&& tokens[3] == "executed:"
		&& !tokens[4].empty()) {
		if (tokens[2] != server.getRCONUsername()) {
			if (m_default_settings.m_suppress_rcon_command_logs) { // TODO: move away from per-stream settings
				// Suppress RCON command logs from other RCON users
				return;
			}
		}
		else if (m_command_tracker.empty()) {
			// This command response wasn't requested by any current upstream connections; suppress it
			return;
		}
		else {
			upstream_server_info* front_server_info = m_command_tracker.front();
			if (front_server_info == nullptr
				|| front_server_info->m_processing_command
				|| tokens[4] != front_server_info->m_response_queue.front().m_command) {
				// This command response wasn't requested by any current upstream connections; suppress it
				return;
			}

			// This is the next command we're been waiting on; mark processing command and let this go through
			front_server_info->m_processing_command = true;

			// This is a command response for an upstream command; this is only relevant to one server: that server
			// Always echo the command back exactly as it was sent
			std::string line_sanitized;
			const auto& rcon_username = get_upstream_rcon_username(*front_server_info, server);
			if (rcon_username == server.getRCONUsername()) {
				// No need to recombine tokens
				line_sanitized = line;
			}
			else {
				// TODO: add assignment operators to Jupiter::string crap
				tokens[2] = rcon_username;

				// Construct line to send and send it
				line_sanitized = tokens[0];
				for (size_t index = 1; index != tokens.size(); ++index) {
					line_sanitized += RenX::DelimC;
					line_sanitized += tokens[index];
				}
			}
			line_sanitized += '\n';

			send_upstream(*front_server_info, line_sanitized, server);
			return;
		}
	}

	for (auto& server_info : server_info_map_itr->second) {
		// Pass tokens by copy so sanitizations can differ per-upstream
		// TODO: optimize to only copy when needed
		// TODO: only generate sanitized message once if all upstreams are configured the same (i.e: all match default)
		process_renx_message(server, server_info, line, tokens);
	}
}